

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O3

void highwayhash::MeasureDurations(Func func,DurationsForInputs *input_map,uint8_t *arg)

{
  unsigned_long uVar1;
  FuncInput FVar2;
  _Base_ptr p_Var3;
  Item *pIVar4;
  uint resolution;
  undefined8 uVar5;
  undefined8 uVar6;
  Duration DVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  _Rb_tree_node_base *p_Var12;
  float **ppfVar13;
  pointer puVar14;
  pointer puVar15;
  size_t sVar16;
  _Base_ptr p_Var17;
  unsigned_long uVar18;
  unsigned_long *puVar19;
  _Base_ptr p_Var20;
  ulong uVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> distribution;
  Inputs inputs;
  DurationSamples samples;
  DurationSamples samples_1;
  mt19937_64 rng;
  mt19937_64 *in_stack_fffffffffffff518;
  double local_ae0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_ab8;
  undefined1 local_aa0 [24];
  pointer local_a88;
  iterator iStack_a80;
  unsigned_long *local_a78;
  ulong local_a70;
  DurationSamples local_a68;
  DurationSamples local_a30;
  mt19937_64 local_9f8;
  
  local_9f8._M_x[0] = 0x1571;
  lVar10 = 1;
  uVar18 = 0x1571;
  do {
    uVar18 = (uVar18 >> 0x3e ^ uVar18) * 0x5851f42d4c957f2d + lVar10;
    local_9f8._M_x[lVar10] = uVar18;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x138);
  local_9f8._M_p = 0x138;
  if (((anonymous_namespace)::
       Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::resolution ==
       '\0') &&
     (iVar9 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)
                                   ::resolution), iVar9 != 0)) {
    (anonymous_namespace)::
    Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::resolution =
         anon_unknown_0::EstimateResolution(func,arg);
    __cxa_guard_release(&(anonymous_namespace)::
                         Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)
                         ::resolution);
  }
  resolution = (anonymous_namespace)::
               Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::
               resolution;
  uVar21 = (ulong)(anonymous_namespace)::
                  Resolution(unsigned_long(*)(void_const*,unsigned_long),unsigned_char_const*)::
                  resolution;
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_ab8,input_map->inputs_,
             input_map->inputs_ + input_map->num_inputs_,(allocator_type *)local_aa0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_aa0,&local_ab8);
  uVar6 = local_aa0._8_8_;
  uVar5 = local_aa0._0_8_;
  if (local_aa0._0_8_ != local_aa0._8_8_) {
    uVar11 = (long)(local_aa0._8_8_ - local_aa0._0_8_) >> 3;
    lVar10 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_aa0._0_8_,local_aa0._8_8_,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,uVar6);
    if (local_aa0._0_8_ != local_aa0._8_8_) {
      puVar19 = (pointer)(local_aa0._0_8_ + 8);
      do {
        puVar14 = puVar19;
        if (puVar14 == (pointer)local_aa0._8_8_) goto LAB_0010d6e0;
        puVar19 = puVar14 + 1;
      } while (puVar14[-1] != *puVar14);
      puVar15 = puVar14 + -1;
      uVar18 = puVar14[-1];
      for (; puVar19 != (unsigned_long *)local_aa0._8_8_; puVar19 = puVar19 + 1) {
        uVar1 = *puVar19;
        if (uVar18 != uVar1) {
          puVar15[1] = uVar1;
          puVar15 = puVar15 + 1;
        }
        uVar18 = uVar1;
      }
      if (puVar15 + 1 != (pointer)local_aa0._8_8_) {
        local_aa0._8_8_ = puVar15 + 1;
      }
    }
  }
LAB_0010d6e0:
  uVar21 = ((ulong)((long)local_ab8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_ab8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * uVar21 * 400;
  local_a88 = (pointer)0x0;
  iStack_a80._M_current = (unsigned_long *)0x0;
  local_a78 = (unsigned_long *)0x0;
  do {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a88,
               ((long)local_ab8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_ab8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) +
               ((long)iStack_a80._M_current - (long)local_a88 >> 3));
    puVar14 = local_ab8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (puVar15 = local_ab8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start; puVar15 != puVar14;
        puVar15 = puVar15 + 1) {
      local_a68.num_samples_ = *puVar15;
      if (iStack_a80._M_current == local_a78) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a88,iStack_a80,
                   &local_a68.num_samples_);
      }
      else {
        *iStack_a80._M_current = local_a68.num_samples_;
        iStack_a80._M_current = iStack_a80._M_current + 1;
      }
    }
    DVar7 = anon_unknown_0::TotalDuration
                      (resolution,func,arg,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a88,
                       &local_9f8);
  } while (DVar7 <= uVar21 && uVar21 - DVar7 != 0);
  uVar21 = (long)iStack_a80._M_current - (long)local_a88 >> 3;
  uVar11 = (long)local_ab8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_ab8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_a70 = uVar21 / uVar11;
  local_ae0 = 1.0;
  if (local_a70 != 1) {
    printf("NumReplicas %zu\n",local_a70,uVar21 % uVar11);
    local_ae0 = (double)(int)local_a70;
  }
  anon_unknown_0::GatherDurationSamples
            (&local_a68,resolution,(Inputs *)local_aa0,func,arg,(size_t)&local_9f8,
             in_stack_fffffffffffff518);
  for (p_Var12 = local_a68.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != &local_a68.samples_for_input_._M_t._M_impl.super__Rb_tree_header
      ; p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    FVar2 = *(FuncInput *)(p_Var12 + 1);
    p_Var17 = p_Var12[1]._M_parent;
    p_Var3 = p_Var12[1]._M_left;
    p_Var20 = p_Var17;
    if (p_Var17 != p_Var3) {
      uVar21 = (long)p_Var3 - (long)p_Var17 >> 2;
      lVar10 = 0x3f;
      if (uVar21 != 0) {
        for (; uVar21 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var17,p_Var3,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var17,p_Var3);
      p_Var17 = p_Var12[1]._M_left;
      p_Var20 = p_Var12[1]._M_parent;
    }
    uVar8 = Mode<unsigned_int>(&p_Var20->_M_color,(long)p_Var17 - (long)p_Var20 >> 2);
    pIVar4 = input_map->items;
    sVar16 = input_map->num_items;
    pIVar4[sVar16].input = FVar2;
    pIVar4[sVar16].num_durations = 1;
    *pIVar4[sVar16].durations = (float)((double)uVar8 * (1.0 / local_ae0));
    input_map->num_items = sVar16 + 1;
  }
  if (1 < input_map->max_durations_) {
    uVar21 = 1;
    do {
      anon_unknown_0::GatherDurationSamples
                (&local_a30,resolution,(Inputs *)local_aa0,func,arg,(size_t)&local_9f8,
                 in_stack_fffffffffffff518);
      for (p_Var12 = local_a30.samples_for_input_._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var12 !=
          &local_a30.samples_for_input_._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
        FVar2 = *(FuncInput *)(p_Var12 + 1);
        p_Var17 = p_Var12[1]._M_parent;
        p_Var3 = p_Var12[1]._M_left;
        p_Var20 = p_Var17;
        if (p_Var17 != p_Var3) {
          uVar11 = (long)p_Var3 - (long)p_Var17 >> 2;
          lVar10 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var17,p_Var3,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var17,p_Var3);
          p_Var17 = p_Var12[1]._M_left;
          p_Var20 = p_Var12[1]._M_parent;
        }
        uVar8 = Mode<unsigned_int>(&p_Var20->_M_color,(long)p_Var17 - (long)p_Var20 >> 2);
        sVar16 = input_map->num_items;
        if (sVar16 != 0) {
          ppfVar13 = &input_map->items->durations;
          do {
            if (((Item *)(ppfVar13 + -2))->input == FVar2) {
              sVar16 = (size_t)ppfVar13[-1];
              (*ppfVar13)[sVar16] = (float)((double)uVar8 * (1.0 / local_ae0));
              ppfVar13[-1] = (float *)(sVar16 + 1);
              break;
            }
            ppfVar13 = ppfVar13 + 3;
            sVar16 = sVar16 - 1;
          } while (sVar16 != 0);
        }
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::~_Rb_tree(&local_a30.samples_for_input_._M_t);
      uVar21 = uVar21 + 1;
    } while (uVar21 < input_map->max_durations_);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&local_a68.samples_for_input_._M_t);
  if (local_a88 != (pointer)0x0) {
    operator_delete(local_a88,(long)local_a78 - (long)local_a88);
  }
  if ((pointer)local_aa0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_aa0._0_8_,local_aa0._16_8_ - local_aa0._0_8_);
  }
  if (local_ab8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_ab8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_ab8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_ab8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MeasureDurations(const Func func, DurationsForInputs* input_map,
                      const uint8_t* arg) {
  std::mt19937_64 rng;
  const Duration resolution = Resolution(func, arg);

  // Adds enough 'replicas' of the distribution to measure "func" given
  // the timer resolution.
  const std::vector<FuncInput> distribution(
      input_map->inputs_, input_map->inputs_ + input_map->num_inputs_);
  Inputs inputs(resolution, distribution, func, arg, &rng);
  const double per_call = 1.0 / static_cast<int>(inputs.NumReplicas());

  // First iteration: populate input_map items.
  auto samples =
      GatherDurationSamples(resolution, inputs, func, arg, 512, &rng);
  samples.Reduce(
      [per_call, input_map](const FuncInput input, const Duration duration) {
        const float sample = static_cast<float>(duration * per_call);
        input_map->AddItem(input, sample);
      });

  // Subsequent iteration(s): append to input_map items' array.
  for (size_t rep = 1; rep < input_map->max_durations_; ++rep) {
    auto samples =
        GatherDurationSamples(resolution, inputs, func, arg, 512, &rng);
    samples.Reduce(
        [per_call, input_map](const FuncInput input, const Duration duration) {
          const float sample = static_cast<float>(duration * per_call);
          input_map->AddSample(input, sample);
        });
  }
}